

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O2

int cpu_request_core_type(cpu_purpose_t purpose,cpu_raw_data_array_t *raw_array,cpu_id_t *data)

{
  long lVar1;
  int iVar2;
  cpu_purpose_t cVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  logical_cpu_t *plVar7;
  cpu_raw_data_t **ppcVar8;
  cpu_raw_data_array_t my_raw_array;
  internal_id_info_t throwaway;
  
  if (raw_array == (cpu_raw_data_array_t *)0x0) {
    iVar2 = cpuid_get_all_raw_data(&my_raw_array);
    if (iVar2 < 0) {
      return iVar2;
    }
    ppcVar8 = &my_raw_array.raw;
    plVar7 = &my_raw_array.num_raw;
  }
  else {
    plVar7 = &raw_array->num_raw;
    ppcVar8 = &raw_array->raw;
  }
  uVar5 = 0xffffffffffffffff;
  iVar2 = -0x11;
  lVar1 = -0x6b0;
  do {
    lVar6 = lVar1;
    uVar5 = uVar5 + 1;
    if (*plVar7 <= uVar5) goto LAB_0010c0dd;
    cVar3 = cpu_ident_purpose((cpu_raw_data_t *)((long)(*ppcVar8)[1].basic_cpuid[0] + lVar6));
    lVar1 = lVar6 + 0x6b0;
  } while (cVar3 != purpose);
  cpu_ident_internal((cpu_raw_data_t *)((long)(*ppcVar8)[1].basic_cpuid[0] + lVar6),data,&throwaway)
  ;
  iVar2 = 0;
LAB_0010c0dd:
  piVar4 = (int *)__tls_get_addr(&PTR_00134f60);
  *piVar4 = iVar2;
  return iVar2;
}

Assistant:

int cpu_request_core_type(cpu_purpose_t purpose, struct cpu_raw_data_array_t* raw_array, struct cpu_id_t* data)
{
	int r;
	logical_cpu_t logical_cpu = 0;
	struct cpu_raw_data_array_t my_raw_array;
	struct internal_id_info_t throwaway;

	if (!raw_array) {
		if ((r = cpuid_get_all_raw_data(&my_raw_array)) < 0)
			return r;
		raw_array = &my_raw_array;
	}

	for (logical_cpu = 0; logical_cpu < raw_array->num_raw; logical_cpu++) {
		if (cpu_ident_purpose(&raw_array->raw[logical_cpu]) == purpose) {
			cpu_ident_internal(&raw_array->raw[logical_cpu], data, &throwaway);
			return cpuid_set_error(ERR_OK);
		}
	}

	return cpuid_set_error(ERR_NOT_FOUND);
}